

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::IsDeformable(ON_PolyCurve *this)

{
  int iVar1;
  uint uVar2;
  ON_Curve **ppOVar3;
  ON_Curve *seg;
  int segment_index;
  int count;
  bool rc;
  ON_PolyCurve *this_local;
  
  iVar1 = Count(this);
  seg._4_4_ = 0;
  while( true ) {
    if (iVar1 <= seg._4_4_) {
      return true;
    }
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,seg._4_4_);
    if ((*ppOVar3 != (ON_Curve *)0x0) &&
       (uVar2 = (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1d])(),
       (uVar2 & 1) == 0)) break;
    seg._4_4_ = seg._4_4_ + 1;
  }
  return false;
}

Assistant:

bool ON_PolyCurve::IsDeformable() const
{
  bool rc = true;
  const int count = Count();
  int segment_index;
  for ( segment_index = 0; segment_index < count ; segment_index++ )
  {
    const ON_Curve* seg = m_segment[segment_index];
    if ( seg && !seg->IsDeformable() )
    {
      rc = false;
      break;
    }
  }
  return rc;
}